

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::addSyntaxTree
          (Compilation *this,shared_ptr<slang::syntax::SyntaxTree> *tree)

{
  pointer *pppCVar1;
  long lVar2;
  group_type_pointer pgVar3;
  char_pointer puVar4;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
  *ptVar5;
  TokenKind TVar6;
  undefined4 uVar7;
  element_type *peVar8;
  RootSymbol *pRVar9;
  iterator __position;
  group_type_pointer pgVar10;
  size_t __n;
  uint uVar11;
  undefined1 auVar12 [16];
  UnconnectedDrive UVar13;
  size_t *psVar14;
  value_type_pointer ppVar15;
  size_t __n_00;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
  *ptVar16;
  int iVar17;
  SyntaxNode *pSVar18;
  ulong pos0;
  char_pointer puVar19;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
  *ptVar20;
  uint64_t hash;
  logic_error *this_00;
  uint uVar21;
  value_type_pointer ppVar22;
  group_type_pointer pgVar23;
  code *pcVar24;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar25;
  SyntaxTree *unaff_RBP;
  table_element_pointer ppVar26;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar27;
  EVP_PKEY_CTX *ctx;
  undefined *puVar28;
  basic_string_view<char,_std::char_traits<char>_> *pbVar29;
  basic_string_view<char,_std::char_traits<char>_> *pbVar30;
  ulong hash_00;
  value_type_pointer pbVar31;
  ulong uVar32;
  SyntaxNode *pSVar33;
  value_type_pointer pbVar34;
  basic_string_view<char,_std::char_traits<char>_> *pbVar35;
  NetType *args_1;
  char_pointer puVar36;
  value_type_pointer pbVar37;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
  *ptVar38;
  Compilation *this_01;
  Compilation *pCVar39;
  long lVar40;
  bool bVar41;
  uchar uVar42;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar50;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar52;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar53;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar54;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar55;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar56;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar57;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar58;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar59;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar60;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar61;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar62;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar63;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar64;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar65;
  undefined1 auVar51 [16];
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar66;
  iterator iVar67;
  iterator iVar68;
  value_type *elements_1;
  value_type *elements_2;
  value_type *elements;
  CompilationUnitSymbol *unit;
  locator res;
  try_emplace_args_t local_e9;
  basic_string_view<char,_std::char_traits<char>_> *local_e8;
  Compilation *local_e0;
  value_type_pointer local_d8;
  value_type_pointer local_d0;
  uint64_t local_c8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
  *local_c0;
  value_type_pointer local_b8;
  EVP_PKEY_CTX *local_b0;
  value_type_pointer local_a8;
  SyntaxTree *local_a0;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  SyntaxNode *local_78;
  locator local_70;
  undefined8 local_58;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_50;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4f;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4e;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4d;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4c;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4b;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4a;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_49;
  ulong local_40;
  group_type_pointer local_38;
  
  peVar8 = (tree->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b0 = (EVP_PKEY_CTX *)tree;
  if (peVar8 == (element_type *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this_00,"tree cannot be null");
    puVar28 = &std::invalid_argument::typeinfo;
    pcVar24 = std::invalid_argument::~invalid_argument;
    goto LAB_003d8180;
  }
  if (this->finalized != true) {
    if (peVar8->sourceMan != this->sourceManager) {
      if (this->sourceManager != (SourceManager *)0x0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,
                   "All syntax trees added to the compilation must use the same source manager");
        goto LAB_003d8172;
      }
      this->sourceManager = peVar8->sourceMan;
    }
    args_1 = (NetType *)peVar8->library;
    local_e0 = this;
    if (args_1 == (NetType *)0x0) {
      args_1 = (NetType *)this->defaultLibPtr;
    }
    else {
      ptVar20 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                 *)&this->libraryNameMap;
      local_90._M_str = *(char **)&args_1->super_Symbol;
      local_90._M_len = (args_1->super_Symbol).name._M_len;
      hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)ptVar20
                        ,&local_90);
      __n_00 = local_90._M_len;
      pbVar31 = (value_type_pointer)
                (hash >> ((byte)(this->libraryNameMap).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                                .arrays.groups_size_index & 0x3f));
      ppVar22 = (value_type_pointer)
                (this->libraryNameMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                .arrays.groups_;
      lVar2 = (hash & 0xff) * 4;
      hVar50 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (&UNK_0051f39c + lVar2);
      hVar52 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (&UNK_0051f39d + lVar2);
      hVar53 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (&UNK_0051f39e + lVar2);
      hVar54 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (&UNK_0051f39f + lVar2);
      local_a8 = (this->libraryNameMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                 .arrays.elements_;
      local_a0 = (SyntaxTree *)local_90._M_str;
      pbVar37 = (value_type_pointer)(ulong)((uint)hash & 7);
      pbVar30 = (basic_string_view<char,_std::char_traits<char>_> *)
                (this->libraryNameMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                .arrays.groups_size_mask;
      pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      pbVar34 = pbVar31;
      hVar55 = hVar50;
      hVar56 = hVar52;
      hVar57 = hVar53;
      hVar58 = hVar54;
      hVar59 = hVar50;
      hVar60 = hVar52;
      hVar61 = hVar53;
      hVar62 = hVar54;
      hVar63 = hVar50;
      hVar64 = hVar52;
      hVar65 = hVar53;
      hVar66 = hVar54;
      do {
        ppVar15 = local_a8;
        phVar27 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  ((long)pbVar34 * 0x10);
        phVar25 = phVar27 + (long)&ppVar22->first;
        auVar46[0] = -(*phVar25 == hVar50);
        auVar46[1] = -(phVar25[1] == hVar52);
        auVar46[2] = -(phVar25[2] == hVar53);
        auVar46[3] = -(phVar25[3] == hVar54);
        auVar46[4] = -(phVar25[4] == hVar55);
        auVar46[5] = -(phVar25[5] == hVar56);
        auVar46[6] = -(phVar25[6] == hVar57);
        auVar46[7] = -(phVar25[7] == hVar58);
        auVar46[8] = -(phVar25[8] == hVar59);
        auVar46[9] = -(phVar25[9] == hVar60);
        auVar46[10] = -(phVar25[10] == hVar61);
        auVar46[0xb] = -(phVar25[0xb] == hVar62);
        auVar46[0xc] = -(phVar25[0xc] == hVar63);
        auVar46[0xd] = -(phVar25[0xd] == hVar64);
        auVar46[0xe] = -(phVar25[0xe] == hVar65);
        auVar46[0xf] = -(phVar25[0xf] == hVar66);
        uVar21 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
        pSVar33 = (SyntaxNode *)pbVar34;
        pbVar35 = pbVar29;
        if (uVar21 != 0) {
          local_58._0_2_ = CONCAT11(hVar52,hVar50);
          local_58._0_3_ = CONCAT12(hVar53,(undefined2)local_58);
          local_58._0_4_ = CONCAT13(hVar54,(undefined3)local_58);
          local_58._0_5_ = CONCAT14(hVar55,(undefined4)local_58);
          local_58._0_6_ = CONCAT15(hVar56,(undefined5)local_58);
          local_58._0_7_ = CONCAT16(hVar57,(undefined6)local_58);
          local_58 = (NetType *)CONCAT17(hVar58,(undefined7)local_58);
          local_e8 = pbVar30;
          local_d8 = ppVar22;
          local_d0 = pbVar31;
          local_c8 = hash;
          local_c0 = ptVar20;
          local_b8 = pbVar37;
          local_98 = phVar27;
          local_80 = pbVar29;
          local_78 = (SyntaxNode *)pbVar34;
          hStack_50 = hVar59;
          hStack_4f = hVar60;
          hStack_4e = hVar61;
          hStack_4d = hVar62;
          hStack_4c = hVar63;
          hStack_4b = hVar64;
          hStack_4a = hVar65;
          hStack_49 = hVar66;
          do {
            unaff_RBP = (SyntaxTree *)(ulong)uVar21;
            uVar11 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            ppVar22 = (value_type_pointer)(ppVar15 + (long)pbVar34 * 0xf + (ulong)uVar11);
            bVar41 = __n_00 == ((basic_string_view<char,_std::char_traits<char>_> *)&ppVar22->first)
                               ->_M_len;
            if (bVar41 && __n_00 != 0) {
              iVar17 = bcmp(local_a0,(ppVar22->second).tree,__n_00);
              bVar41 = iVar17 == 0;
              hVar50 = local_58._0_1_;
              hVar52 = local_58._1_1_;
              hVar53 = local_58._2_1_;
              hVar54 = local_58._3_1_;
              hVar55 = local_58._4_1_;
              hVar56 = local_58._5_1_;
              hVar57 = local_58._6_1_;
              hVar58 = local_58._7_1_;
              hVar59 = hStack_50;
              hVar60 = hStack_4f;
              hVar61 = hStack_4e;
              hVar62 = hStack_4d;
              hVar63 = hStack_4c;
              hVar64 = hStack_4b;
              hVar65 = hStack_4a;
              hVar66 = hStack_49;
            }
            hash = local_c8;
            pbVar31 = local_d0;
            ptVar20 = local_c0;
            if (bVar41) goto LAB_003d8092;
            uVar21 = uVar21 - 1 & uVar21;
            pbVar37 = local_b8;
            phVar27 = local_98;
            ppVar22 = local_d8;
            pbVar30 = local_e8;
            pSVar33 = local_78;
            pbVar35 = local_80;
          } while (uVar21 != 0);
        }
        unaff_RBP = (SyntaxTree *)(phVar27 + (long)ppVar22);
        if ((*(byte *)((long)&unaff_RBP->rootNode + 7) & (byte)pbVar37[0x51f79]._M_len) == 0) break;
        pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&pbVar35->_M_len + 1);
        pbVar34 = (value_type_pointer)
                  ((ulong)((long)&pbVar35->_M_len +
                          (long)((long)&((value_type_pointer)pSVar33)->_M_len + 1)) & (ulong)pbVar30
                  );
      } while (pbVar29 <= pbVar30);
      ppVar22 = (value_type_pointer)0x0;
LAB_003d8092:
      pCVar39 = local_e0;
      if (ppVar22 == (value_type_pointer)0x0) {
        if ((local_e0->libraryNameMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
            .size_ctrl.size <
            (local_e0->libraryNameMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)&local_70,ptVar20,(arrays_type *)ptVar20,(size_t)pbVar31,hash,
                     &local_e9,&local_90);
          psVar14 = &(pCVar39->libraryNameMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                     .size_ctrl.size;
          *psVar14 = *psVar14 + 1;
          ppVar22 = local_70.p;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)&local_70,ptVar20,hash,&local_e9,&local_90);
          ppVar22 = local_70.p;
        }
      }
      (ppVar22->second).defaultNetType = args_1;
    }
    pCVar39 = local_e0;
    local_78 = *(SyntaxNode **)(*(long *)local_b0 + 8);
    pSVar33 = local_78;
    do {
      pSVar18 = pSVar33;
      pSVar33 = pSVar18->parent;
    } while (pSVar33 != (SyntaxNode *)0x0);
    local_90._M_len =
         (size_t)BumpAllocator::
                 emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
                           (&local_e0->super_BumpAllocator,local_e0,(SourceLibrary *)args_1);
    (((CompilationUnitSymbol *)local_90._M_len)->super_Symbol).originatingSyntax = pSVar18;
    pRVar9 = (pCVar39->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    Scope::insertMember(&pRVar9->super_Scope,(Symbol *)local_90._M_len,
                        (pRVar9->super_Scope).lastMember,false,true);
    __position._M_current =
         (pCVar39->compilationUnits).
         super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pCVar39->compilationUnits).
        super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<slang::ast::CompilationUnitSymbol_const*,std::allocator<slang::ast::CompilationUnitSymbol_const*>>
      ::_M_realloc_insert<slang::ast::CompilationUnitSymbol_const*const&>
                ((vector<slang::ast::CompilationUnitSymbol_const*,std::allocator<slang::ast::CompilationUnitSymbol_const*>>
                  *)&pCVar39->compilationUnits,__position,(CompilationUnitSymbol **)&local_90);
    }
    else {
      *__position._M_current = (CompilationUnitSymbol *)local_90._M_len;
      pppCVar1 = &(pCVar39->compilationUnits).
                  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
    iVar67 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
             ::begin(*(table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                       **)(*(long *)local_b0 + 0x158));
    if (iVar67.p_ != (table_element_pointer)0x0) {
      local_e8 = (basic_string_view<char,_std::char_traits<char>_> *)&pCVar39->syntaxMetadata;
      this_01 = pCVar39;
LAB_003d788d:
      ppVar26 = iVar67.p_;
      local_a0 = *(SyntaxTree **)local_b0;
      local_58 = getNetType(this_01,(ppVar26->second).defaultNetType);
      pCVar39 = local_e0;
      local_a8 = (value_type_pointer)
                 CONCAT44(local_a8._4_4_,
                          (ppVar26->second).timeScale.
                          super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::TimeScale>._M_payload);
      TVar6 = (ppVar26->second).unconnectedDrive;
      UVar13 = (uint)(TVar6 == Pull1Keyword) * 2;
      if (TVar6 == Pull0Keyword) {
        UVar13 = Pull0;
      }
      auVar12._8_8_ = 0;
      auVar12._0_8_ = ppVar26->first;
      hash_00 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
      pos0 = hash_00 >>
             ((byte)(this_01->syntaxMetadata).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                    .arrays.groups_size_index & 0x3f);
      local_c8 = CONCAT71(local_c8._1_7_,
                          (ppVar26->second).timeScale.
                          super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::TimeScale>._M_engaged);
      local_c0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                  *)CONCAT71(local_c0._1_7_,(ppVar26->second).cellDefine);
      pgVar10 = (this_01->syntaxMetadata).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                .arrays.groups_;
      uVar7 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash_00 & 0xff];
      local_d8 = (this_01->syntaxMetadata).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                 .arrays.elements_;
      local_b8 = (value_type_pointer)
                 (this_01->syntaxMetadata).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                 .arrays.groups_size_mask;
      uVar32 = pos0;
      pbVar37 = (value_type_pointer)0x0;
      do {
        local_d0 = pbVar37;
        pgVar3 = pgVar10 + uVar32;
        uVar42 = (uchar)uVar7;
        auVar51[0] = -(pgVar3->m[0].n == uVar42);
        uVar47 = (uchar)((uint)uVar7 >> 8);
        auVar51[1] = -(pgVar3->m[1].n == uVar47);
        uVar48 = (uchar)((uint)uVar7 >> 0x10);
        auVar51[2] = -(pgVar3->m[2].n == uVar48);
        uVar49 = (uchar)((uint)uVar7 >> 0x18);
        auVar51[3] = -(pgVar3->m[3].n == uVar49);
        auVar51[4] = -(pgVar3->m[4].n == uVar42);
        auVar51[5] = -(pgVar3->m[5].n == uVar47);
        auVar51[6] = -(pgVar3->m[6].n == uVar48);
        auVar51[7] = -(pgVar3->m[7].n == uVar49);
        auVar51[8] = -(pgVar3->m[8].n == uVar42);
        auVar51[9] = -(pgVar3->m[9].n == uVar47);
        auVar51[10] = -(pgVar3->m[10].n == uVar48);
        auVar51[0xb] = -(pgVar3->m[0xb].n == uVar49);
        auVar51[0xc] = -(pgVar3->m[0xc].n == uVar42);
        auVar51[0xd] = -(pgVar3->m[0xd].n == uVar47);
        auVar51[0xe] = -(pgVar3->m[0xe].n == uVar48);
        auVar51[0xf] = -(pgVar3->m[0xf].n == uVar49);
        for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe); uVar21 != 0;
            uVar21 = uVar21 - 1 & uVar21) {
          uVar11 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          if (ppVar26->first == local_d8[uVar32 * 0xf + (ulong)uVar11].first) {
            ppVar22 = local_d8 + uVar32 * 0xf + (ulong)uVar11;
            goto LAB_003d79f6;
          }
        }
        if ((pgVar10[uVar32].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)hash_00 & 7]) == 0) {
          ppVar22 = (value_type_pointer)0x0;
          goto LAB_003d79f6;
        }
        pbVar37 = (value_type_pointer)((long)&local_d0->_M_len + 1);
        uVar32 = (long)&local_d0->_M_len + uVar32 + 1 & (ulong)local_b8;
      } while (pbVar37 <= local_b8);
      ppVar22 = (value_type_pointer)0x0;
LAB_003d79f6:
      if (ppVar22 == (value_type_pointer)0x0) {
        if ((local_e0->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .size_ctrl.size <
            (local_e0->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*const&>
                    (&local_70,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                      *)local_e8,(arrays_type *)local_e8,pos0,hash_00,&local_e9,&ppVar26->first);
          psVar14 = &(pCVar39->syntaxMetadata).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                     .size_ctrl.size;
          *psVar14 = *psVar14 + 1;
          ppVar22 = local_70.p;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*const&>
                    (&local_70,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                      *)local_e8,hash_00,&local_e9,&ppVar26->first);
          ppVar22 = local_70.p;
        }
      }
      (ppVar22->second).tree = local_a0;
      (ppVar22->second).defaultNetType = local_58;
      (ppVar22->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload = local_a8._0_4_;
      (ppVar22->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_engaged = local_c8._0_1_;
      *(undefined2 *)&(ppVar22->second).field_0x15 = local_70.pg._0_2_;
      (ppVar22->second).field_0x17 = local_70.pg._2_1_;
      (ppVar22->second).unconnectedDrive = UVar13;
      (ppVar22->second).cellDefine = local_c0._0_1_;
      puVar19 = iVar67.pc_ + 2;
      do {
        puVar36 = puVar19;
        puVar19 = iVar67.pc_;
        ppVar26 = iVar67.p_ + 1;
        if (((uint)iVar67.pc_ & 0xf) == 0xe) goto LAB_003d7ac7;
        puVar4 = puVar36 + -1;
        iVar67.p_ = ppVar26;
        iVar67.pc_ = puVar19 + 1;
        puVar19 = puVar36 + 1;
      } while (*puVar4 == '\0');
      puVar36 = puVar36 + -1;
      if (*puVar4 == '\x01') {
        ppVar26 = (table_element_pointer)0x0;
      }
      goto LAB_003d7ab8;
    }
LAB_003d7b3c:
    iVar68 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)(*(long *)(*(long *)local_b0 + 0x158) + 0x30));
    if (iVar68.p_ == (table_element_pointer)0x0) {
LAB_003d7e13:
      if (local_78->kind == CompilationUnit) {
        lVar2 = *(long *)(local_78 + 3);
        if (lVar2 != 0) {
          pSVar33 = local_78[2].previewNode;
          lVar40 = 0;
          do {
            CompilationUnitSymbol::addMembers
                      ((CompilationUnitSymbol *)local_90._M_len,
                       *(SyntaxNode **)((long)&pSVar33->kind + lVar40));
            lVar40 = lVar40 + 8;
          } while (lVar2 << 3 != lVar40);
        }
      }
      else if (local_78->kind == LibraryMap) {
        lVar2 = *(long *)(local_78 + 3);
        if (lVar2 != 0) {
          pSVar33 = local_78[2].previewNode;
          lVar40 = 0;
          do {
            CompilationUnitSymbol::addMembers
                      ((CompilationUnitSymbol *)local_90._M_len,
                       *(SyntaxNode **)((long)&pSVar33->kind + lVar40));
            lVar40 = lVar40 + 8;
          } while (lVar2 << 3 != lVar40);
        }
      }
      else {
        CompilationUnitSymbol::addMembers((CompilationUnitSymbol *)local_90._M_len,local_78);
      }
      ctx = local_b0;
      std::
      vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
      ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
                ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
                  *)&pCVar39->syntaxTrees,(shared_ptr<slang::syntax::SyntaxTree> *)local_b0);
      if ((pCVar39->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
          _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
          super__Optional_payload_base<slang::Diagnostics>._M_engaged == true) {
        (pCVar39->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
        _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
        super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
        SmallVectorBase<slang::Diagnostic>::cleanup
                  ((SmallVectorBase<slang::Diagnostic> *)&pCVar39->cachedParseDiagnostics,ctx);
      }
      return;
    }
    phVar25 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              &pCVar39->globalInstantiations;
    local_98 = phVar25;
LAB_003d7b76:
    pbVar30 = iVar68.p_;
    local_c0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                *)iVar68.pc_;
    local_d8 = (value_type_pointer)
               hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (phVar25,pbVar30);
    pbVar37 = (value_type_pointer)
              ((ulong)local_d8 >>
              ((byte)(pCVar39->globalInstantiations).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                     .arrays.groups_size_index & 0x3f));
    pgVar23 = (pCVar39->globalInstantiations).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .arrays.groups_;
    lVar2 = ((ulong)local_d8 & 0xff) * 4;
    hVar50 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (&UNK_0051f39c + lVar2);
    hVar52 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (&UNK_0051f39d + lVar2);
    hVar53 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (&UNK_0051f39e + lVar2);
    hVar54 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (&UNK_0051f39f + lVar2);
    local_d0 = (pCVar39->globalInstantiations).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.elements_;
    uVar32 = (ulong)((uint)local_d8 & 7);
    local_80 = (basic_string_view<char,_std::char_traits<char>_> *)
               (pCVar39->globalInstantiations).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
    pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    hVar55 = hVar50;
    hVar56 = hVar52;
    hVar57 = hVar53;
    hVar58 = hVar54;
    hVar59 = hVar50;
    hVar60 = hVar52;
    hVar61 = hVar53;
    hVar62 = hVar54;
    hVar63 = hVar50;
    hVar64 = hVar52;
    hVar65 = hVar53;
    hVar66 = hVar54;
    local_b8 = pbVar37;
    do {
      pbVar31 = local_d0;
      local_c8 = (long)pbVar37 * 0x10;
      phVar27 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (pgVar23 + (long)pbVar37);
      auVar44[0] = -(*phVar27 == hVar50);
      auVar44[1] = -(phVar27[1] == hVar52);
      auVar44[2] = -(phVar27[2] == hVar53);
      auVar44[3] = -(phVar27[3] == hVar54);
      auVar44[4] = -(phVar27[4] == hVar55);
      auVar44[5] = -(phVar27[5] == hVar56);
      auVar44[6] = -(phVar27[6] == hVar57);
      auVar44[7] = -(phVar27[7] == hVar58);
      auVar44[8] = -(phVar27[8] == hVar59);
      auVar44[9] = -(phVar27[9] == hVar60);
      auVar44[10] = -(phVar27[10] == hVar61);
      auVar44[0xb] = -(phVar27[0xb] == hVar62);
      auVar44[0xc] = -(phVar27[0xc] == hVar63);
      auVar44[0xd] = -(phVar27[0xd] == hVar64);
      auVar44[0xe] = -(phVar27[0xe] == hVar65);
      auVar44[0xf] = -(phVar27[0xf] == hVar66);
      uVar21 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe);
      if (uVar21 != 0) {
        __n = (((table_type *)&pbVar30->_M_len)->
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
              ).arrays.groups_size_index;
        local_a8 = (value_type_pointer)pbVar30->_M_str;
        local_58._0_2_ = CONCAT11(hVar52,hVar50);
        local_58._0_3_ = CONCAT12(hVar53,(undefined2)local_58);
        local_58._0_4_ = CONCAT13(hVar54,(undefined3)local_58);
        local_58._0_5_ = CONCAT14(hVar55,(undefined4)local_58);
        local_58._0_6_ = CONCAT15(hVar56,(undefined5)local_58);
        local_58._0_7_ = CONCAT16(hVar57,(undefined6)local_58);
        local_58 = (NetType *)CONCAT17(hVar58,(undefined7)local_58);
        local_a0 = unaff_RBP;
        local_e8 = pbVar30;
        hStack_50 = hVar59;
        hStack_4f = hVar60;
        hStack_4e = hVar61;
        hStack_4d = hVar62;
        hStack_4c = hVar63;
        hStack_4b = hVar64;
        hStack_4a = hVar65;
        hStack_49 = hVar66;
        local_40 = uVar32;
        local_38 = pgVar23;
        do {
          iVar17 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
            }
          }
          bVar41 = __n == *(size_t *)
                           ((long)&pbVar31[(long)pbVar37 * 0xf]._M_len + (ulong)(uint)(iVar17 << 4))
          ;
          unaff_RBP = (SyntaxTree *)
                      ((long)&pbVar31[(long)pbVar37 * 0xf]._M_len + (ulong)(uint)(iVar17 << 4));
          if (bVar41 && __n != 0) {
            iVar17 = bcmp(local_a8,unaff_RBP->rootNode,__n);
            bVar41 = iVar17 == 0;
            hVar50 = local_58._0_1_;
            hVar52 = local_58._1_1_;
            hVar53 = local_58._2_1_;
            hVar54 = local_58._3_1_;
            hVar55 = local_58._4_1_;
            hVar56 = local_58._5_1_;
            hVar57 = local_58._6_1_;
            hVar58 = local_58._7_1_;
            hVar59 = hStack_50;
            hVar60 = hStack_4f;
            hVar61 = hStack_4e;
            hVar62 = hStack_4d;
            hVar63 = hStack_4c;
            hVar64 = hStack_4b;
            hVar65 = hStack_4a;
            hVar66 = hStack_49;
          }
          phVar25 = local_98;
          pCVar39 = local_e0;
          pbVar30 = local_e8;
          if (bVar41) goto LAB_003d7d1d;
          uVar21 = uVar21 - 1 & uVar21;
          pgVar23 = local_38;
          uVar32 = local_40;
          unaff_RBP = local_a0;
        } while (uVar21 != 0);
      }
      if ((pgVar23->m[local_c8 + 0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar32]) == 0) break;
      psVar14 = &pbVar29->_M_len;
      pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&pbVar29->_M_len + 1);
      pbVar37 = (value_type_pointer)
                ((ulong)((long)psVar14 + (long)((long)&pbVar37->_M_len + 1)) & (ulong)local_80);
    } while (pbVar29 <= local_80);
    unaff_RBP = (SyntaxTree *)0x0;
LAB_003d7d1d:
    if (unaff_RBP == (SyntaxTree *)0x0) {
      if ((pCVar39->globalInstantiations).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.size <
          (pCVar39->globalInstantiations).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)&local_70,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)phVar25,(arrays_type *)phVar25,(size_t)local_b8,(size_t)local_d8,pbVar30);
        psVar14 = &(pCVar39->globalInstantiations).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                   .size_ctrl.size;
        *psVar14 = *psVar14 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)&local_70,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)phVar25,(size_t)local_d8,pbVar30);
      }
    }
    ptVar20 = local_c0;
    ptVar16 = local_c0 + 2;
    do {
      ptVar38 = ptVar16;
      pbVar30 = pbVar30 + 1;
      if (((uint)ptVar20 & 0xf) == 0xe) goto LAB_003d7da0;
      ptVar5 = ptVar38 + -1;
      ptVar20 = ptVar20 + 1;
      ptVar16 = ptVar38 + 1;
    } while (*ptVar5 ==
             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
              )0x0);
    ptVar38 = ptVar38 + -1;
    if (*ptVar5 ==
        (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
         )0x1) {
      pbVar30 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    }
    goto LAB_003d7d90;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"The compilation has already been finalized");
LAB_003d8172:
  puVar28 = &std::logic_error::typeinfo;
  pcVar24 = std::logic_error::~logic_error;
LAB_003d8180:
  __cxa_throw(this_00,puVar28,pcVar24);
LAB_003d7ac7:
  do {
    auVar43[0] = -(*puVar36 == '\0');
    auVar43[1] = -(puVar36[1] == '\0');
    auVar43[2] = -(puVar36[2] == '\0');
    auVar43[3] = -(puVar36[3] == '\0');
    auVar43[4] = -(puVar36[4] == '\0');
    auVar43[5] = -(puVar36[5] == '\0');
    auVar43[6] = -(puVar36[6] == '\0');
    auVar43[7] = -(puVar36[7] == '\0');
    auVar43[8] = -(puVar36[8] == '\0');
    auVar43[9] = -(puVar36[9] == '\0');
    auVar43[10] = -(puVar36[10] == '\0');
    auVar43[0xb] = -(puVar36[0xb] == '\0');
    auVar43[0xc] = -(puVar36[0xc] == '\0');
    auVar43[0xd] = -(puVar36[0xd] == '\0');
    auVar43[0xe] = -(puVar36[0xe] == '\0');
    auVar43[0xf] = -(puVar36[0xf] == '\0');
    uVar21 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
    if (uVar21 == 0x7fff) {
      puVar36 = puVar36 + 0x10;
      ppVar26 = ppVar26 + 0xf;
    }
    else {
      uVar11 = 0;
      if ((uVar21 ^ 0x7fff) != 0) {
        for (; ((uVar21 ^ 0x7fff) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      if (puVar36[uVar11] == '\x01') {
        ppVar26 = (table_element_pointer)0x0;
      }
      else {
        puVar36 = puVar36 + uVar11;
        ppVar26 = ppVar26 + uVar11;
      }
    }
  } while (uVar21 == 0x7fff);
LAB_003d7ab8:
  iVar67.p_ = ppVar26;
  iVar67.pc_ = puVar36;
  this_01 = pCVar39;
  if (ppVar26 == (table_element_pointer)0x0) goto code_r0x003d7ac1;
  goto LAB_003d788d;
code_r0x003d7ac1:
  unaff_RBP = (SyntaxTree *)0x0;
  goto LAB_003d7b3c;
LAB_003d7da0:
  do {
    auVar45[0] = -(*ptVar38 ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[1] = -(ptVar38[1] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[2] = -(ptVar38[2] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[3] = -(ptVar38[3] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[4] = -(ptVar38[4] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[5] = -(ptVar38[5] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[6] = -(ptVar38[6] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[7] = -(ptVar38[7] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[8] = -(ptVar38[8] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[9] = -(ptVar38[9] ==
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                   )0x0);
    auVar45[10] = -(ptVar38[10] ==
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                    )0x0);
    auVar45[0xb] = -(ptVar38[0xb] ==
                    (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                     )0x0);
    auVar45[0xc] = -(ptVar38[0xc] ==
                    (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                     )0x0);
    auVar45[0xd] = -(ptVar38[0xd] ==
                    (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                     )0x0);
    auVar45[0xe] = -(ptVar38[0xe] ==
                    (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                     )0x0);
    auVar45[0xf] = -(ptVar38[0xf] ==
                    (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                     )0x0);
    uVar21 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
    if (uVar21 == 0x7fff) {
      ptVar38 = ptVar38 + 0x10;
      pbVar30 = pbVar30 + 0xf;
    }
    else {
      uVar11 = 0;
      if ((uVar21 ^ 0x7fff) != 0) {
        for (; ((uVar21 ^ 0x7fff) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      if (ptVar38[uVar11] ==
          (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
           )0x1) {
        pbVar30 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      }
      else {
        ptVar38 = ptVar38 + uVar11;
        pbVar30 = (basic_string_view<char,_std::char_traits<char>_> *)
                  ((long)&pbVar30->_M_len + (ulong)(uVar11 << 4));
      }
    }
  } while (uVar21 == 0x7fff);
LAB_003d7d90:
  iVar68.p_ = pbVar30;
  iVar68.pc_ = (char_pointer)ptVar38;
  if (pbVar30 == (basic_string_view<char,_std::char_traits<char>_> *)0x0) goto LAB_003d7e13;
  goto LAB_003d7b76;
}

Assistant:

void Compilation::addSyntaxTree(std::shared_ptr<SyntaxTree> tree) {
    SLANG_ASSERT(!isFrozen());

    if (!tree)
        SLANG_THROW(std::invalid_argument("tree cannot be null"));

    if (finalized)
        SLANG_THROW(std::logic_error("The compilation has already been finalized"));

    if (&tree->sourceManager() != sourceManager) {
        if (!sourceManager)
            sourceManager = &tree->sourceManager();
        else {
            SLANG_THROW(std::logic_error(
                "All syntax trees added to the compilation must use the same source manager"));
        }
    }

    auto lib = tree->getSourceLibrary();
    if (lib) {
        auto& entry = libraryNameMap[lib->name];
        SLANG_ASSERT(entry == nullptr || entry == lib);
        entry = lib;
    }
    else {
        lib = defaultLibPtr;
    }

    const SyntaxNode& node = tree->root();
    const SyntaxNode* topNode = &node;
    while (topNode->parent)
        topNode = topNode->parent;

    auto unit = emplace<CompilationUnitSymbol>(*this, *lib);
    unit->setSyntax(*topNode);
    root->addMember(*unit);
    compilationUnits.push_back(unit);

    for (auto& [n, meta] : tree->getMetadata().nodeMap) {
        SyntaxMetadata result;
        result.tree = tree.get();
        result.defaultNetType = &getNetType(meta.defaultNetType);
        result.timeScale = meta.timeScale;

        switch (meta.unconnectedDrive) {
            case TokenKind::Pull0Keyword:
                result.unconnectedDrive = UnconnectedDrive::Pull0;
                break;
            case TokenKind::Pull1Keyword:
                result.unconnectedDrive = UnconnectedDrive::Pull1;
                break;
            default:
                result.unconnectedDrive = UnconnectedDrive::None;
                break;
        }

        result.cellDefine = meta.cellDefine;

        syntaxMetadata[n] = result;
    }

    for (auto& name : tree->getMetadata().globalInstances)
        globalInstantiations.emplace(name);

    if (node.kind == SyntaxKind::CompilationUnit) {
        for (auto member : node.as<CompilationUnitSyntax>().members)
            unit->addMembers(*member);
    }
    else if (node.kind == SyntaxKind::LibraryMap) {
        for (auto member : node.as<LibraryMapSyntax>().members)
            unit->addMembers(*member);
    }
    else {
        unit->addMembers(node);
    }

    syntaxTrees.emplace_back(std::move(tree));
    cachedParseDiagnostics.reset();
}